

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite15_Test::~LiteBasicTest_AllLite15_Test
          (LiteBasicTest_AllLite15_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite15) {
  {
    // Accessors
    proto2_unittest::TestMapLite message;

    MapTestUtil::SetMapFields(&message);
    MapTestUtil::ExpectMapFieldsSet(message);

    MapTestUtil::ModifyMapFields(&message);
    MapTestUtil::ExpectMapFieldsModified(message);
  }
}